

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::createCompositeCompare
          (Builder *this,Decoration precision,Id value1,Id value2,bool equal)

{
  uint typeId;
  pointer ppIVar1;
  Id IVar2;
  value_type_conflict1 size;
  Id IVar3;
  Id IVar4;
  Id IVar5;
  Op OVar6;
  value_type_conflict1 member;
  Decoration local_80;
  allocator_type local_6d;
  Op local_6c;
  value_type_conflict1 local_68;
  value_type_conflict1 local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  Vector<unsigned_int> indexes;
  
  IVar2 = makeBoolType(this);
  local_50 = (ulong)value1;
  typeId = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[local_50]->typeId;
  size = getNumTypeConstituents(this,typeId);
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  OVar6 = ppIVar1[typeId]->opCode;
  if (OVar6 < OpTypeOpaque) {
    if ((0xf00000U >> (OVar6 & OpTypeOpaque) & 1) != 0) {
      if (typeId == ppIVar1[value2]->typeId) {
        OVar6 = getMostBasicTypeClass(this,typeId);
        if (OVar6 == OpTypeBool) {
          OVar6 = equal ^ OpLogicalNotEqual;
          local_80 = DecorationMax;
        }
        else {
          local_80 = precision;
          if (OVar6 == OpTypeFloat) {
            OVar6 = (uint)!equal * 2 + OpFOrdEqual;
          }
          else {
            OVar6 = equal ^ OpINotEqual;
          }
        }
        if ((this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start[typeId]->opCode - OpTypeBool < 3) {
          IVar2 = createBinOp(this,OVar6,IVar2,value1,value2);
        }
        else {
          IVar5 = makeVectorType(this,IVar2,size);
          IVar5 = createBinOp(this,OVar6,IVar5,value1,value2);
          setPrecision(this,IVar5,local_80);
          IVar2 = createUnaryOp(this,equal | OpAny,IVar2,IVar5);
        }
        IVar2 = setPrecision(this,IVar2,local_80);
        return IVar2;
      }
      __assert_fail("valueType == getTypeId(value2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                    ,0x784,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
    }
    if ((0x71000000U >> (OVar6 & OpTypeOpaque) & 1) != 0) {
      local_58 = (ulong)value2;
      local_60 = (ulong)equal;
      local_6c = equal + OpLogicalOr;
      member = 0;
      if ((int)size < 1) {
        size = 0;
      }
      IVar5 = 0;
      local_68 = size;
      for (; local_68 != member; member = member + 1) {
        local_64 = member;
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                   &indexes.
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>,
                   1,&local_64,&local_6d);
        IVar3 = getContainedTypeId(this,(this->module).idToInstruction.
                                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[local_50]->typeId,
                                   member);
        IVar4 = getContainedTypeId(this,(this->module).idToInstruction.
                                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[local_58]->typeId,
                                   member);
        IVar3 = createCompositeExtract
                          (this,value1,IVar3,
                           (Vector<unsigned_int> *)
                           &indexes.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          );
        IVar4 = createCompositeExtract
                          (this,value2,IVar4,
                           (Vector<unsigned_int> *)
                           &indexes.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          );
        IVar3 = createCompositeCompare(this,precision,IVar3,IVar4,SUB81(local_60,0));
        if (member != 0) {
          IVar5 = createBinOp(this,local_6c,IVar2,IVar5,IVar3);
          IVar3 = setPrecision(this,IVar5,precision);
        }
        std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
        ~_Vector_base(&indexes.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     );
        IVar5 = IVar3;
      }
      return IVar5;
    }
  }
  __assert_fail("isAggregateType(valueType) || isMatrixType(valueType)",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x7a6,"Id spv::Builder::createCompositeCompare(Decoration, Id, Id, bool)");
}

Assistant:

Id Builder::createCompositeCompare(Decoration precision, Id value1, Id value2, bool equal)
{
    Id boolType = makeBoolType();
    Id valueType = getTypeId(value1);

    Id resultId = NoResult;

    int numConstituents = getNumTypeConstituents(valueType);

    // Scalars and Vectors

    if (isScalarType(valueType) || isVectorType(valueType)) {
        assert(valueType == getTypeId(value2));
        // These just need a single comparison, just have
        // to figure out what it is.
        Op op;
        switch (getMostBasicTypeClass(valueType)) {
        case OpTypeFloat:
            op = equal ? OpFOrdEqual : OpFOrdNotEqual;
            break;
        case OpTypeInt:
        default:
            op = equal ? OpIEqual : OpINotEqual;
            break;
        case OpTypeBool:
            op = equal ? OpLogicalEqual : OpLogicalNotEqual;
            precision = NoPrecision;
            break;
        }

        if (isScalarType(valueType)) {
            // scalar
            resultId = createBinOp(op, boolType, value1, value2);
        } else {
            // vector
            resultId = createBinOp(op, makeVectorType(boolType, numConstituents), value1, value2);
            setPrecision(resultId, precision);
            // reduce vector compares...
            resultId = createUnaryOp(equal ? OpAll : OpAny, boolType, resultId);
        }

        return setPrecision(resultId, precision);
    }

    // Only structs, arrays, and matrices should be left.
    // They share in common the reduction operation across their constituents.
    assert(isAggregateType(valueType) || isMatrixType(valueType));

    // Compare each pair of constituents
    for (int constituent = 0; constituent < numConstituents; ++constituent) {
        dxil_spv::Vector<unsigned> indexes(1, constituent);
        Id constituentType1 = getContainedTypeId(getTypeId(value1), constituent);
        Id constituentType2 = getContainedTypeId(getTypeId(value2), constituent);
        Id constituent1 = createCompositeExtract(value1, constituentType1, indexes);
        Id constituent2 = createCompositeExtract(value2, constituentType2, indexes);

        Id subResultId = createCompositeCompare(precision, constituent1, constituent2, equal);

        if (constituent == 0)
            resultId = subResultId;
        else
            resultId = setPrecision(createBinOp(equal ? OpLogicalAnd : OpLogicalOr, boolType, resultId, subResultId), precision);
    }

    return resultId;
}